

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_string_replace(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int is_replaceAll)

{
  JSValue *pJVar1;
  ushort uVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  JSValue new_target;
  JSValue JVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  JSString *pJVar11;
  JSValueUnion JVar12;
  JSValueUnion JVar13;
  JSValueUnion JVar14;
  ulong uVar15;
  JSContext *pJVar16;
  uint uVar17;
  int64_t iVar18;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  uint32_t from;
  JSValueUnion JVar19;
  JSRefCountHeader *p;
  JSValueUnion p2;
  JSRefCountHeader *p_3;
  uint uVar20;
  char cVar21;
  JSValue this_val_00;
  JSValue JVar22;
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue JVar23;
  JSValue JVar24;
  JSValue JVar25;
  JSValue JVar26;
  int64_t local_128;
  JSClass *local_108;
  ulong local_100;
  JSValueUnion local_f8;
  int local_f0;
  StringBuffer local_c8;
  JSValueUnion local_a8;
  ulong local_a0;
  JSValueUnion local_98;
  int64_t local_90;
  JSValueUnion local_88;
  int64_t local_80;
  undefined4 local_78;
  undefined8 local_70;
  undefined4 local_68;
  undefined8 local_60;
  JSValueUnion local_58;
  int64_t local_50;
  undefined4 local_40;
  uint uStack_3c;
  undefined8 uStack_38;
  
  if (((uint)this_val.tag & 0xfffffffe) == 2) {
    JS_ThrowTypeError(ctx,"cannot convert to object");
    goto LAB_00168296;
  }
  JVar12 = argv->u;
  JVar25 = *argv;
  JVar26 = *argv;
  JVar24 = *argv;
  JVar23 = *argv;
  pJVar1 = argv + 1;
  pvVar3 = (pJVar1->u).ptr;
  iVar18 = argv[1].tag;
  JVar22 = *pJVar1;
  JVar6 = *pJVar1;
  if (((uint)argv->tag & 0xfffffffe) != 2) {
    if ((is_replaceAll != 0) && (iVar9 = check_regexp_g_flag(ctx,*argv), iVar9 < 0)) {
LAB_00167e78:
      return (JSValue)(ZEXT816(6) << 0x40);
    }
    JVar23 = JS_GetPropertyInternal(ctx,JVar23,0xc9,JVar24,0);
    argv = (JSValue *)JVar12;
    if (1 < (int)JVar23.tag - 2U) {
      if ((int)JVar23.tag != 6) {
        local_a8 = this_val.u;
        local_a0 = this_val.tag;
        local_98.ptr = pvVar3;
        local_90 = iVar18;
        JVar23 = JS_CallFree(ctx,JVar23,JVar25,2,(JSValue *)&local_a8);
        return JVar23;
      }
      goto LAB_00167e78;
    }
  }
  local_c8.len = 0;
  local_c8.size = 0;
  local_c8.is_wide_char = 0;
  local_c8.error_status = 0;
  local_c8.ctx = ctx;
  pJVar11 = js_alloc_string(ctx,0,0);
  if (pJVar11 == (JSString *)0x0) {
    local_c8._16_8_ = local_c8._16_8_ & 0xffffffff;
    local_c8.error_status = -1;
  }
  local_108 = (JSClass *)0x0;
  local_c8.str = pJVar11;
  JVar24 = JS_ToStringInternal(ctx,this_val,0);
  JVar12 = JVar24.u;
  JVar23 = (JSValue)(ZEXT816(3) << 0x40);
  uVar20 = (uint)JVar24.tag;
  pJVar16 = ctx;
  if (uVar20 == 6) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = JVar24.tag;
    local_100 = 3;
    JVar26 = (JSValue)(auVar5 << 0x40);
  }
  else {
    JVar23 = (JSValue)(ZEXT816(3) << 0x40);
    local_108 = (JSClass *)0x0;
    JVar25 = JS_ToStringInternal(ctx,JVar26,0);
    local_100 = JVar25.tag;
    JVar13 = JVar25.u;
    JVar26 = JVar25;
    if ((int)JVar25.tag != 6) {
      local_f0 = (int)iVar18;
      if (local_f0 == -1) {
        uVar2 = *(ushort *)((long)pvVar3 + 6);
        local_108 = (JSClass *)0x3;
        local_128 = 3;
        uVar15 = local_100;
        if (uVar2 != 0xd) {
          if (uVar2 == 0x29) {
            cVar21 = *(char *)(*(long *)((long)pvVar3 + 0x30) + 0x20);
          }
          else {
            local_108 = ctx->rt->class_array;
            uVar15 = (ulong)uVar2 * 5;
            cVar21 = local_108[uVar2].call != (JSClassCall *)0x0;
          }
          if (cVar21 == '\0') goto LAB_00167ee8;
        }
        bVar7 = false;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = uVar15;
        JVar23 = (JSValue)(auVar4 << 0x40);
LAB_00167f26:
        JVar14.ptr = (void *)((ulong)JVar23.u._0_4_ | (long)local_108 << 0x20);
        uVar15 = *(ulong *)((long)JVar13.ptr + 4);
        bVar8 = false;
        from = 0;
        do {
          iVar18 = JVar23.tag;
          local_f8 = JVar23.u;
          JVar23.tag = local_128;
          JVar23.u.ptr = local_f8.ptr;
          local_100 = JVar25.tag;
          p2 = JVar25.u;
          JVar6.tag = local_100;
          JVar6.u.ptr = JVar13.ptr;
          uVar17 = (uint)JVar25.tag;
          if ((uVar15 & 0x7fffffff) == 0) {
            JVar19.float64 = 0.0;
            if (bVar8) {
              if ((*(uint *)((long)JVar12.ptr + 4) & 0x7fffffff) <= from) break;
              JVar19._4_4_ = 0;
              JVar19.int32 = from + 1;
            }
          }
          else {
            uVar10 = string_indexof((JSString *)JVar12.ptr,(JSString *)p2.ptr,from);
            JVar19._4_4_ = 0;
            JVar19.int32 = uVar10;
            iVar18 = extraout_RDX;
            if ((int)uVar10 < 0) {
              if (!bVar8) {
                (*((local_c8.ctx)->rt->mf).js_free)(&(local_c8.ctx)->rt->malloc_state,local_c8.str);
                if ((0xfffffff4 < uVar17) &&
                   (iVar9 = *p2.ptr, *(int *)p2.ptr = iVar9 + -1, iVar9 < 2)) {
                  __JS_FreeValueRT(ctx->rt,JVar25);
                }
                if ((uint)local_128 < 0xfffffff5) {
                  return JVar24;
                }
                iVar9 = *JVar14.ptr;
                *(int *)JVar14.ptr = iVar9 + -1;
                if (1 < iVar9) {
                  return JVar24;
                }
                JVar25.tag = local_128;
                JVar25.u.ptr = JVar14.ptr;
                __JS_FreeValueRT(ctx->rt,JVar25);
                return JVar24;
              }
              break;
            }
          }
          local_a0 = local_100;
          local_a8 = p2;
          if (bVar7) {
            local_80 = 0;
            local_78 = 0;
            local_70 = 3;
            local_68 = 0;
            local_60 = 3;
            local_50 = local_128;
            this_val_00.tag = iVar18;
            this_val_00.u.ptr = &local_a8;
            local_88 = JVar19;
            local_58.ptr = JVar14.ptr;
            _local_98 = JVar24;
            JVar26 = js_string___GetSubstitution(ctx,this_val_00,3,argv);
          }
          else {
            local_90 = 0;
            local_40 = 0;
            uStack_38 = 3;
            new_target.tag = 3;
            new_target.u.ptr = (void *)((ulong)uStack_3c << 0x20);
            argv = (JSValue *)0x3;
            local_98 = JVar19;
            _local_88 = JVar24;
            JVar26 = JS_CallInternal(ctx,JVar22,(JSValue)(ZEXT816(3) << 0x40),new_target,3,
                                     (JSValue *)&local_a8,2);
            JVar26 = JS_ToStringFree(ctx,JVar26);
          }
          if ((int)JVar26.tag == 6) {
            JVar26.tag = JVar26.tag;
            JVar26.u.ptr = JVar13.ptr;
            pJVar16 = local_c8.ctx;
            pJVar11 = local_c8.str;
            goto LAB_0016820c;
          }
          string_buffer_concat(&local_c8,(JSString *)JVar12.ptr,from,JVar19.int32);
          string_buffer_concat_value_free(&local_c8,JVar26);
          JVar23.tag = extraout_RDX_00;
          uVar15 = *(ulong *)((long)JVar13.ptr + 4);
          from = ((uint)uVar15 & 0x7fffffff) + JVar19.int32;
          bVar8 = true;
          p2 = JVar13;
          JVar25 = JVar6;
        } while (is_replaceAll != 0);
        string_buffer_concat
                  (&local_c8,(JSString *)JVar12.ptr,from,
                   *(uint *)((long)JVar12.ptr + 4) & 0x7fffffff);
        if ((0xfffffff4 < uVar17) && (iVar9 = *p2.ptr, *(int *)p2.ptr = iVar9 + -1, iVar9 < 2)) {
          JVar22.tag = local_100;
          JVar22.u.ptr = p2.ptr;
          __JS_FreeValueRT(ctx->rt,JVar22);
        }
        if ((0xfffffff4 < (uint)local_128) &&
           (iVar9 = *JVar14.ptr, *(int *)JVar14.ptr = iVar9 + -1, iVar9 < 2)) {
          v.tag = local_128;
          v.u.ptr = JVar14.ptr;
          __JS_FreeValueRT(ctx->rt,v);
        }
        if ((0xfffffff4 < uVar20) &&
           (iVar9 = *JVar12.ptr, *(int *)JVar12.ptr = iVar9 + -1, iVar9 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar24);
        }
        JVar23 = string_buffer_end(&local_c8);
        return JVar23;
      }
LAB_00167ee8:
      JVar23 = JS_ToStringInternal(ctx,JVar6,0);
      local_128 = JVar23.tag;
      JVar26.tag = local_128;
      JVar26.u.ptr = JVar13.ptr;
      local_108 = (JSClass *)((ulong)JVar23.u.ptr >> 0x20);
      bVar7 = true;
      if ((int)JVar23.tag != 6) goto LAB_00167f26;
    }
  }
LAB_0016820c:
  local_128 = JVar23.tag;
  iVar18 = local_128;
  local_f8 = JVar23.u;
  JVar13 = JVar26.u;
  (*(pJVar16->rt->mf).js_free)(&pJVar16->rt->malloc_state,pJVar11);
  if ((0xfffffff4 < (uint)local_100) &&
     (iVar9 = *JVar13.ptr, *(int *)JVar13.ptr = iVar9 + -1, iVar9 < 2)) {
    v_00.tag = local_100;
    v_00.u.ptr = JVar13.ptr;
    __JS_FreeValueRT(ctx->rt,v_00);
  }
  local_128._0_4_ = (uint)JVar23.tag;
  if (0xfffffff4 < (uint)local_128) {
    v_01.u.ptr = (void *)((ulong)local_f8.ptr & 0xffffffff | (long)local_108 << 0x20);
    iVar9 = *v_01.u.ptr;
    *(int *)v_01.u.ptr = iVar9 + -1;
    if (iVar9 < 2) {
      v_01.tag = iVar18;
      __JS_FreeValueRT(ctx->rt,v_01);
    }
  }
  if ((0xfffffff4 < uVar20) && (iVar9 = *JVar12.ptr, *(int *)JVar12.ptr = iVar9 + -1, iVar9 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar24);
  }
LAB_00168296:
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_string_replace(JSContext *ctx, JSValueConst this_val,
                                 int argc, JSValueConst *argv,
                                 int is_replaceAll)
{
    // replace(rx, rep)
    JSValueConst O = this_val, searchValue = argv[0], replaceValue = argv[1];
    JSValueConst args[6];
    JSValue str, search_str, replaceValue_str, repl_str;
    JSString *sp, *searchp;
    StringBuffer b_s, *b = &b_s;
    int pos, functionalReplace, endOfLastMatch;
    BOOL is_first;

    if (JS_IsUndefined(O) || JS_IsNull(O))
        return JS_ThrowTypeError(ctx, "cannot convert to object");

    search_str = JS_UNDEFINED;
    replaceValue_str = JS_UNDEFINED;
    repl_str = JS_UNDEFINED;

    if (!JS_IsUndefined(searchValue) && !JS_IsNull(searchValue)) {
        JSValue replacer;
        if (is_replaceAll) {
            if (check_regexp_g_flag(ctx, searchValue) < 0)
                return JS_EXCEPTION;
        }
        replacer = JS_GetProperty(ctx, searchValue, JS_ATOM_Symbol_replace);
        if (JS_IsException(replacer))
            return JS_EXCEPTION;
        if (!JS_IsUndefined(replacer) && !JS_IsNull(replacer)) {
            args[0] = O;
            args[1] = replaceValue;
            return JS_CallFree(ctx, replacer, searchValue, 2, args);
        }
    }
    string_buffer_init(ctx, b, 0);

    str = JS_ToString(ctx, O);
    if (JS_IsException(str))
        goto exception;
    search_str = JS_ToString(ctx, searchValue);
    if (JS_IsException(search_str))
        goto exception;
    functionalReplace = JS_IsFunction(ctx, replaceValue);
    if (!functionalReplace) {
        replaceValue_str = JS_ToString(ctx, replaceValue);
        if (JS_IsException(replaceValue_str))
            goto exception;
    }

    sp = JS_VALUE_GET_STRING(str);
    searchp = JS_VALUE_GET_STRING(search_str);
    endOfLastMatch = 0;
    is_first = TRUE;
    for(;;) {
        if (unlikely(searchp->len == 0)) {
            if (is_first)
                pos = 0;
            else if (endOfLastMatch >= sp->len)
                pos = -1;
            else
                pos = endOfLastMatch + 1;
        } else {
            pos = string_indexof(sp, searchp, endOfLastMatch);
        }
        if (pos < 0) {
            if (is_first) {
                string_buffer_free(b);
                JS_FreeValue(ctx, search_str);
                JS_FreeValue(ctx, replaceValue_str);
                return str;
            } else {
                break;
            }
        }
        if (functionalReplace) {
            args[0] = search_str;
            args[1] = JS_NewInt32(ctx, pos);
            args[2] = str;
            repl_str = JS_ToStringFree(ctx, JS_Call(ctx, replaceValue, JS_UNDEFINED, 3, args));
        } else {
            args[0] = search_str;
            args[1] = str;
            args[2] = JS_NewInt32(ctx, pos);
            args[3] = JS_UNDEFINED;
            args[4] = JS_UNDEFINED;
            args[5] = replaceValue_str;
            repl_str = js_string___GetSubstitution(ctx, JS_UNDEFINED, 6, args);
        }
        if (JS_IsException(repl_str))
            goto exception;
        
        string_buffer_concat(b, sp, endOfLastMatch, pos);
        string_buffer_concat_value_free(b, repl_str);
        endOfLastMatch = pos + searchp->len;
        is_first = FALSE;
        if (!is_replaceAll)
            break;
    }
    string_buffer_concat(b, sp, endOfLastMatch, sp->len);
    JS_FreeValue(ctx, search_str);
    JS_FreeValue(ctx, replaceValue_str);
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);

exception:
    string_buffer_free(b);
    JS_FreeValue(ctx, search_str);
    JS_FreeValue(ctx, replaceValue_str);
    JS_FreeValue(ctx, str);
    return JS_EXCEPTION;
}